

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureImageIterator::TextureImageIterator
          (TextureImageIterator *this,ImageInfo *info,int levelCount)

{
  deUint32 dVar1;
  int *piVar2;
  IVec3 *pIVar3;
  int local_44;
  Vector<int,_3> local_28;
  int local_1c;
  ImageInfo *pIStack_18;
  int levelCount_local;
  ImageInfo *info_local;
  TextureImageIterator *this_local;
  
  local_1c = levelCount;
  pIStack_18 = info;
  info_local = (ImageInfo *)this;
  dVar1 = ImageInfo::getTarget(info);
  if (dVar1 == 0x8513) {
    local_44 = 6;
  }
  else {
    dVar1 = ImageInfo::getTarget(info);
    pIVar3 = ImageInfo::getSize(info);
    getLevelSize((anon_unknown_0 *)&local_28,dVar1,pIVar3,0);
    piVar2 = tcu::Vector<int,_3>::z(&local_28);
    local_44 = *piVar2;
  }
  this->m_levelImageCount = local_44;
  ImageInfo::ImageInfo(&this->m_info,info);
  this->m_currentLevel = 0;
  dVar1 = ImageInfo::getTarget(info);
  pIVar3 = ImageInfo::getSize(info);
  getLevelSize((anon_unknown_0 *)&this->m_levelSize,dVar1,pIVar3,0);
  this->m_currentImage = -1;
  this->m_levelCount = local_1c;
  return;
}

Assistant:

TextureImageIterator::TextureImageIterator (const ImageInfo info, int levelCount)
	: m_levelImageCount	(info.getTarget() == GL_TEXTURE_CUBE_MAP ? 6 : getLevelSize(info.getTarget(), info.getSize(), 0).z())
	, m_info			(info)
	, m_currentLevel	(0)
	, m_levelSize		(getLevelSize(info.getTarget(), info.getSize(), 0))
	, m_currentImage	(-1)
	, m_levelCount		(levelCount)
{
	DE_ASSERT(m_levelCount <= getLevelCount(info));
}